

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O1

JoypadButtons * joypad_unpack_buttons(JoypadButtons *__return_storage_ptr__,u8 packed)

{
  undefined7 in_register_00000031;
  ulong uVar1;
  
  uVar1 = CONCAT71(in_register_00000031,packed);
  __return_storage_ptr__->A = (Bool)uVar1 & TRUE;
  __return_storage_ptr__->B = (Bool)(uVar1 >> 1) & TRUE;
  __return_storage_ptr__->select = (Bool)(uVar1 >> 2) & TRUE;
  __return_storage_ptr__->start = (Bool)(uVar1 >> 3) & TRUE;
  __return_storage_ptr__->right = (Bool)(uVar1 >> 4) & TRUE;
  __return_storage_ptr__->left = (Bool)(uVar1 >> 5) & TRUE;
  __return_storage_ptr__->up = (Bool)(uVar1 >> 6) & TRUE;
  __return_storage_ptr__->down = (Bool)uVar1 >> 7;
  return __return_storage_ptr__;
}

Assistant:

JoypadButtons joypad_unpack_buttons(u8 packed) {
  JoypadButtons buttons;
  buttons.A = packed & 1;
  buttons.B = (packed >> 1) & 1;
  buttons.select = (packed >> 2) & 1;
  buttons.start = (packed >> 3) & 1;
  buttons.right = (packed >> 4) & 1;
  buttons.left = (packed >> 5) & 1;
  buttons.up = (packed >> 6) & 1;
  buttons.down = (packed >> 7) & 1;
  return buttons;
}